

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

char * __thiscall CTcMake::look_up_pp_sym(CTcMake *this,char *sym,size_t len)

{
  int iVar1;
  textchar_t *ptVar2;
  size_t sVar3;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  char *found_val;
  CTcMakeDef *def;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  local_28 = (textchar_t *)0x0;
  for (local_20 = *(CTcMakeDef **)(in_RDI + 0x70); local_20 != (CTcMakeDef *)0x0;
      local_20 = CTcMakeDef::get_next(local_20)) {
    ptVar2 = CTcMakeDef::get_sym((CTcMakeDef *)0x206ae0);
    sVar3 = strlen(ptVar2);
    if (sVar3 == in_RDX) {
      ptVar2 = CTcMakeDef::get_sym((CTcMakeDef *)0x206af9);
      iVar1 = memcmp(ptVar2,in_RSI,in_RDX);
      if (iVar1 == 0) {
        iVar1 = CTcMakeDef::is_def(local_20);
        if (iVar1 == 0) {
          local_30 = (textchar_t *)0x0;
        }
        else {
          local_30 = CTcMakeDef::get_expan((CTcMakeDef *)0x206b29);
        }
        local_28 = local_30;
      }
    }
  }
  return local_28;
}

Assistant:

const char *CTcMake::look_up_pp_sym(const char *sym, size_t len)
{
    CTcMakeDef *def;
    const char *found_val;

    /* iterate over our symbols to find this definition */
    for (found_val = 0, def = def_head_ ; def != 0 ; def = def->get_next())
    {
        /* if this one matches, note it */
        if (strlen(def->get_sym()) == len
            && memcmp(def->get_sym(), sym, len) == 0)
        {
            /* 
             *   it's a match - if this is a definition, remember it as the
             *   latest definition; if it's an undefinition, forget any
             *   previous definition we've noted 
             */
            found_val = (def->is_def() ? def->get_expan() : 0);
        }
    }

    /* return the definition we found, if any */
    return found_val;
}